

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeArrayValue(BuiltStyledStreamWriter *this,Value *value)

{
  ostream *poVar1;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  ulong uVar5;
  bool local_c1;
  uint local_b0;
  allocator local_a9;
  uint index_1;
  Value *local_88;
  Value *childValue;
  uint index;
  bool hasChildValue;
  bool local_55;
  bool isMultiLine;
  allocator local_41;
  string local_40;
  ArrayIndex local_1c;
  Value *pVStack_18;
  uint size;
  Value *value_local;
  BuiltStyledStreamWriter *this_local;
  
  pVStack_18 = value;
  value_local = (Value *)this;
  local_1c = Value::size(value);
  if (local_1c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"[]",&local_41);
    pushValue(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    local_c1 = true;
    if (this->cs_ != All) {
      local_c1 = isMultineArray(this,pVStack_18);
    }
    local_55 = local_c1;
    if (local_c1 == false) {
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->childValues_);
      if (sVar4 != local_1c) {
        __assert_fail("childValues_.size() == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/covscript[P]online-ide/lib_json/json_writer.cpp"
                      ,0x3cf,"void Json::BuiltStyledStreamWriter::writeArrayValue(const Value &)");
      }
      std::operator<<((this->super_StreamWriter).sout_,"[");
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator<<((this->super_StreamWriter).sout_," ");
      }
      for (local_b0 = 0; local_b0 < local_1c; local_b0 = local_b0 + 1) {
        if (local_b0 != 0) {
          std::operator<<((this->super_StreamWriter).sout_,", ");
        }
        poVar1 = (this->super_StreamWriter).sout_;
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->childValues_,(ulong)local_b0);
        std::operator<<(poVar1,(string *)pvVar3);
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::operator<<((this->super_StreamWriter).sout_," ");
      }
      std::operator<<((this->super_StreamWriter).sout_,"]");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&index,"[",(allocator *)((long)&childValue + 7));
      writeWithIndent(this,(string *)&index);
      std::__cxx11::string::~string((string *)&index);
      std::allocator<char>::~allocator((allocator<char> *)((long)&childValue + 7));
      indent(this);
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->childValues_);
      childValue._6_1_ = (bVar2 ^ 0xffU) & 1;
      childValue._0_4_ = 0;
      while( true ) {
        local_88 = Value::operator[](pVStack_18,(ArrayIndex)childValue);
        writeCommentBeforeValue(this,local_88);
        if ((childValue._6_1_ & 1) == 0) {
          if (((byte)this->field_0xd8 >> 1 & 1) == 0) {
            writeIndent(this);
          }
          this->field_0xd8 = this->field_0xd8 & 0xfd | 2;
          writeValue(this,local_88);
          this->field_0xd8 = this->field_0xd8 & 0xfd;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->childValues_,(ulong)(ArrayIndex)childValue);
          writeWithIndent(this,pvVar3);
        }
        childValue._0_4_ = (ArrayIndex)childValue + 1;
        if ((ArrayIndex)childValue == local_1c) break;
        std::operator<<((this->super_StreamWriter).sout_,",");
        writeCommentAfterValueOnSameLine(this,local_88);
      }
      writeCommentAfterValueOnSameLine(this,local_88);
      unindent(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&index_1,"]",&local_a9);
      writeWithIndent(this,(string *)&index_1);
      std::__cxx11::string::~string((string *)&index_1);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeArrayValue(Value const& value) {
  unsigned size = value.size();
  if (size == 0)
    pushValue("[]");
  else {
    bool isMultiLine = (cs_ == CommentStyle::All) || isMultineArray(value);
    if (isMultiLine) {
      writeWithIndent("[");
      indent();
      bool hasChildValue = !childValues_.empty();
      unsigned index = 0;
      for (;;) {
        Value const& childValue = value[index];
        writeCommentBeforeValue(childValue);
        if (hasChildValue)
          writeWithIndent(childValues_[index]);
        else {
          if (!indented_) writeIndent();
          indented_ = true;
          writeValue(childValue);
          indented_ = false;
        }
        if (++index == size) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        *sout_ << ",";
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("]");
    } else // output on a single line
    {
      assert(childValues_.size() == size);
      *sout_ << "[";
      if (!indentation_.empty()) *sout_ << " ";
      for (unsigned index = 0; index < size; ++index) {
        if (index > 0)
          *sout_ << ", ";
        *sout_ << childValues_[index];
      }
      if (!indentation_.empty()) *sout_ << " ";
      *sout_ << "]";
    }
  }
}